

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

int __thiscall CWire::GetRoutableLength(CWire *this,int iLayer)

{
  short sVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  CLayer *this_00;
  CBoundary *pCVar7;
  
  this_00 = CDesign::GetLayer(CObject::m_pDesign,iLayer);
  uVar4 = (this->super_CObject).m_iProp;
  if ((uVar4 & 5) == 0) {
    if ((uVar4 & 10) == 0) {
      return -1;
    }
    iVar5 = CLayer::IsHorizontal(this_00);
    if (iVar5 == 0) {
      sVar1 = this->m_pPointS->m_iX;
      if (sVar1 != this->m_pPointE->m_iX) {
        __assert_fail("m_pPointS->X()==m_pPointE->X()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x5ac,"int CWire::GetRoutableLength(int)");
      }
      sVar2 = this->m_pPointS->m_iY;
      sVar3 = this->m_pPointE->m_iY;
      if (sVar2 < sVar3) {
        iVar5 = 0;
        while( true ) {
          if ((int)sVar3 - (int)sVar2 == iVar5) {
            return -1;
          }
          pCVar7 = CLayer::GetBoundary(this_00,(int)sVar1,sVar2 + iVar5);
          iVar6 = CBoundary::GetCapacity(pCVar7,0x1000);
          if (iVar6 < 2) break;
          iVar5 = iVar5 + 1;
        }
        return iVar5;
      }
      __assert_fail("iMinY<iMaxY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x5b1,"int CWire::GetRoutableLength(int)");
    }
  }
  else {
    iVar5 = CLayer::IsVertical(this_00);
    if (iVar5 == 0) {
      sVar1 = this->m_pPointS->m_iY;
      if (sVar1 != this->m_pPointE->m_iY) {
        __assert_fail("m_pPointS->Y()==m_pPointE->Y()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x59d,"int CWire::GetRoutableLength(int)");
      }
      sVar2 = this->m_pPointS->m_iX;
      sVar3 = this->m_pPointE->m_iX;
      if (sVar2 < sVar3) {
        iVar5 = 0;
        while( true ) {
          if ((int)sVar3 - (int)sVar2 == iVar5) {
            return -1;
          }
          pCVar7 = CLayer::GetBoundary(this_00,sVar2 + iVar5,(int)sVar1);
          iVar6 = CBoundary::GetCapacity(pCVar7,0x1000);
          if (iVar6 < 2) break;
          iVar5 = iVar5 + 1;
        }
        return iVar5;
      }
      __assert_fail("iMinX<iMaxX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x5a3,"int CWire::GetRoutableLength(int)");
    }
  }
  return 0;
}

Assistant:

int CWire::GetRoutableLength(int iLayer)
{
	CLayer*	pLayer		=	GetDesign()->GetLayer(iLayer);

	if(IsHorizontal())
	{
		if(pLayer->IsVertical())	return	FALSE;

		assert(m_pPointS->Y()==m_pPointE->Y());
		int	iY		=	m_pPointS->Y();
		int iMinX	=	m_pPointS->X();
		int	iMaxX	=	m_pPointE->X();

		// the last point doesn't require to update boundary [6/18/2006 thyeros]
		assert(iMinX<iMaxX);

		for (int i=iMinX;i<iMaxX;++i)	
			if(pLayer->GetBoundary(i,iY)->GetCapacity(GET_MODE_ACAP)<WIRE_WIDTH_SPACE)	return	i-iMinX;
	}
	else if(IsVertical())
	{
		if(pLayer->IsHorizontal())	return	FALSE;

		assert(m_pPointS->X()==m_pPointE->X());
		int	iX		=	m_pPointS->X();
		int iMinY	=	m_pPointS->Y();
		int	iMaxY	=	m_pPointE->Y();

		assert(iMinY<iMaxY);

		for (int i=iMinY;i<iMaxY;++i)
			//	if(pLayer->GetBoundary(iX,i)->GetCongestion()>0.8) 	return	FALSE;

			if(pLayer->GetBoundary(iX,i)->GetCapacity(GET_MODE_ACAP)<WIRE_WIDTH_SPACE)	return	i-iMinY;
	}	

	return	-1;
}